

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QFlags<QItemSelectionModel::SelectionFlag>,_true>::
     debugStream(QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QDebug *in_RSI;
  long in_FS_OFFSET;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> in_stack_ffffffffffffffec;
  QDebug *this;
  
  this = *(QDebug **)(in_FS_OFFSET + 0x28);
  QDebug::QDebug((QDebug *)&stack0xffffffffffffffe8,in_RSI);
  operator<<<QFlags<QItemSelectionModel::SelectionFlag>,_true>
            (in_RSI,(QFlags<QItemSelectionModel::SelectionFlag>)in_stack_ffffffffffffffec.i);
  QDebug::~QDebug(this);
  QDebug::~QDebug(this);
  if (*(QDebug **)(in_FS_OFFSET + 0x28) == this) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }